

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  float *pfVar1;
  ImGuiNavLayer IVar2;
  ImGuiWindow *pIVar3;
  ImVec2 *pIVar4;
  uint uVar5;
  float fVar6;
  ImVec2 IVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  
  if (((GImGui->NavDisableHighlight != false) || (GImGui->NavDisableMouseHover != true)) ||
     (pIVar3 = GImGui->NavWindow, pIVar3 == (ImGuiWindow *)0x0)) {
    if ((-256000.0 <= (GImGui->IO).MousePos.x) && (-256000.0 <= (GImGui->IO).MousePos.y)) {
      return (GImGui->IO).MousePos;
    }
    return GImGui->LastValidMousePos;
  }
  IVar2 = GImGui->NavLayer;
  fVar6 = (GImGui->Style).FramePadding.x * 4.0;
  fVar12 = pIVar3->NavRectRel[IVar2].Min.x;
  fVar9 = pIVar3->NavRectRel[IVar2].Max.x - fVar12;
  if (fVar9 <= fVar6) {
    fVar6 = fVar9;
  }
  fVar9 = pIVar3->NavRectRel[IVar2].Max.y;
  fVar8 = (GImGui->Style).FramePadding.y;
  fVar11 = fVar9 - pIVar3->NavRectRel[IVar2].Min.y;
  if (fVar11 <= fVar8) {
    fVar8 = fVar11;
  }
  fVar8 = (fVar9 - fVar8) + (pIVar3->Pos).y;
  fVar9 = (GImGui->IO).DisplayVisibleMin.x;
  pIVar4 = &(GImGui->IO).DisplayVisibleMax;
  if ((fVar9 != pIVar4->x) || (NAN(fVar9) || NAN(pIVar4->x))) {
    fVar9 = (GImGui->IO).DisplayVisibleMin.y;
    pfVar1 = &(GImGui->IO).DisplayVisibleMax.y;
    if ((fVar9 != *pfVar1) || (NAN(fVar9) || NAN(*pfVar1))) {
      IVar10 = (GImGui->IO).DisplayVisibleMin;
      pIVar4 = &(GImGui->IO).DisplayVisibleMax;
      goto LAB_00124ea4;
    }
  }
  pIVar4 = &(GImGui->IO).DisplaySize;
  IVar10.x = 0.0;
  IVar10.y = 0.0;
LAB_00124ea4:
  fVar6 = fVar6 + fVar12 + (pIVar3->Pos).x;
  IVar13 = *pIVar4;
  fVar12 = IVar10.y;
  if ((IVar10.y <= fVar8) && (fVar12 = IVar13.y, fVar8 <= IVar13.y)) {
    fVar12 = fVar8;
  }
  if (fVar6 <= IVar13.x) {
    IVar13.x = fVar6;
  }
  uVar5 = -(uint)(fVar6 < IVar10.x);
  IVar7.x = (float)(int)(float)(uVar5 & (uint)IVar10.x | ~uVar5 & (uint)IVar13.x);
  IVar7.y = (float)(int)fVar12;
  return IVar7;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.LastValidMousePos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImRect visible_rect = GetViewportRect();
        return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in back-end might be lossy and result in undesirable non-zero delta.
    }
}